

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::LiteralString(Rune *runes,int nrunes,ParseFlags flags)

{
  int local_3c;
  int i;
  Regexp *re;
  ParseFlags flags_local;
  int nrunes_local;
  Rune *runes_local;
  
  if (nrunes < 1) {
    runes_local = (Rune *)operator_new(0x28);
    Regexp((Regexp *)runes_local,kRegexpEmptyMatch,flags);
  }
  else if (nrunes == 1) {
    runes_local = (Rune *)NewLiteral(*runes,flags);
  }
  else {
    runes_local = (Rune *)operator_new(0x28);
    Regexp((Regexp *)runes_local,kRegexpLiteralString,flags);
    for (local_3c = 0; local_3c < nrunes; local_3c = local_3c + 1) {
      AddRuneToString((Regexp *)runes_local,runes[local_3c]);
    }
  }
  return (Regexp *)runes_local;
}

Assistant:

Regexp* Regexp::LiteralString(Rune* runes, int nrunes, ParseFlags flags) {
  if (nrunes <= 0)
    return new Regexp(kRegexpEmptyMatch, flags);
  if (nrunes == 1)
    return NewLiteral(runes[0], flags);
  Regexp* re = new Regexp(kRegexpLiteralString, flags);
  for (int i = 0; i < nrunes; i++)
    re->AddRuneToString(runes[i]);
  return re;
}